

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::GetTempDirectories
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *list)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined1 local_120 [8];
  stat statbuf;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string dstr;
  char *d;
  char **__end1;
  char **__begin1;
  char *(*__range1) [4];
  char *candidates [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(list);
  __range1 = (char *(*) [4])getenv("TEST_TMPDIR");
  candidates[0] = getenv("TMPDIR");
  candidates[1] = getenv("TMP");
  candidates[2] = "/tmp";
  __end1 = (char **)&__range1;
  do {
    if (__end1 == candidates + 3) {
      return;
    }
    pcVar3 = *__end1;
    if (pcVar3 != (char *)0x0) {
      dstr.field_2._8_8_ = pcVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_78,pcVar3,&local_79);
      std::allocator<char>::~allocator(&local_79);
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_78);
      if (*pcVar3 != '/') {
        std::__cxx11::string::operator+=((string *)local_78,"/");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(list,(value_type *)local_78);
      iVar2 = stat((char *)dstr.field_2._8_8_,(stat *)local_120);
      if ((iVar2 == 0) && (((uint)statbuf.st_nlink & 0xf000) == 0x4000)) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)local_78);
      if (bVar1) {
        return;
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

static void GetTempDirectories(vector<string>& list) {
  list.clear();
#ifdef GLOG_OS_WINDOWS
  // On windows we'll try to find a directory in this order:
  //   C:/Documents & Settings/whomever/TEMP (or whatever GetTempPath() is)
  //   C:/TMP/
  //   C:/TEMP/
  char tmp[MAX_PATH];
  if (GetTempPathA(MAX_PATH, tmp)) list.push_back(tmp);
  list.push_back("C:\\TMP\\");
  list.push_back("C:\\TEMP\\");
#else
  // Directories, in order of preference. If we find a dir that
  // exists, we stop adding other less-preferred dirs
  const char* candidates[] = {
      // Non-null only during unittest/regtest
      getenv("TEST_TMPDIR"),

      // Explicitly-supplied temp dirs
      getenv("TMPDIR"),
      getenv("TMP"),

      // If all else fails
      "/tmp",
  };

  for (auto d : candidates) {
    if (!d) continue;  // Empty env var

    // Make sure we don't surprise anyone who's expecting a '/'
    string dstr = d;
    if (dstr[dstr.size() - 1] != '/') {
      dstr += "/";
    }
    list.push_back(dstr);

    struct stat statbuf;
    if (!stat(d, &statbuf) && S_ISDIR(statbuf.st_mode)) {
      // We found a dir that exists - we're done.
      return;
    }
  }
#endif
}